

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

string * __thiscall
pybind11::detail::error_fetch_and_normalize::format_value_and_trace_abi_cxx11_
          (string *__return_storage_ptr__,error_fetch_and_normalize *this)

{
  int iVar1;
  PyObject *pPVar2;
  PyObject *pPVar3;
  PyTypeObject *pPVar4;
  char cVar5;
  PyTypeObject *op;
  object value_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  object value_bytes;
  string message_error_string;
  Py_ssize_t length;
  char *buffer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  message_error_string._M_dataplus._M_p = (pointer)&message_error_string.field_2;
  message_error_string._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  message_error_string.field_2._M_local_buf[0] = '\0';
  if ((this->m_value).super_handle.m_ptr == (PyObject *)0x0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  else {
    value_str.super_handle.m_ptr = (handle)PyObject_Str();
    if (value_str.super_handle.m_ptr == (PyObject *)0x0) {
      detail::error_string_abi_cxx11_();
      std::__cxx11::string::operator=((string *)&message_error_string,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::assign((char *)__return_storage_ptr__);
    }
    else {
      value_bytes.super_handle.m_ptr =
           (handle)PyUnicode_AsEncodedString
                             (value_str.super_handle.m_ptr,"utf-8","backslashreplace");
      if (value_bytes.super_handle.m_ptr == (PyObject *)0x0) {
        detail::error_string_abi_cxx11_();
        std::__cxx11::string::operator=((string *)&message_error_string,(string *)&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
      else {
        iVar1 = PyBytes_AsStringAndSize(value_bytes.super_handle.m_ptr);
        if (iVar1 == -1) {
          detail::error_string_abi_cxx11_();
          std::__cxx11::string::operator=((string *)&message_error_string,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::assign((char *)__return_storage_ptr__);
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,0,0);
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_88);
          std::__cxx11::string::~string((string *)&local_88);
        }
      }
      object::~object(&value_bytes);
    }
    object::~object(&value_str);
  }
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  pPVar3 = (this->m_trace).super_handle.m_ptr;
  cVar5 = (char)__return_storage_ptr__;
  if (pPVar3 == (PyObject *)0x0) {
    if (message_error_string._M_string_length == 0) goto LAB_0011f3fa;
    std::__cxx11::string::push_back(cVar5);
  }
  else {
    do {
      pPVar2 = pPVar3;
      pPVar3 = (PyObject *)pPVar2[1].ob_refcnt;
    } while (pPVar3 != (PyObject *)0x0);
    op = pPVar2[1].ob_type;
    if (op != (PyTypeObject *)0x0) {
      (op->ob_base).ob_base.ob_refcnt = (op->ob_base).ob_base.ob_refcnt + 1;
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    while (op != (PyTypeObject *)0x0) {
      pPVar3 = (PyObject *)PyFrame_GetCode(op);
      iVar1 = PyFrame_GetLineNumber(op);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      value_str.super_handle.m_ptr = (handle)pPVar3[6].ob_type;
      cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_88,&value_str.super_handle);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::to_string(&local_88,iVar1);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      value_str.super_handle.m_ptr = (handle)pPVar3[7].ob_refcnt;
      cast<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_88,&value_str.super_handle);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::push_back(cVar5);
      _Py_DECREF(pPVar3);
      pPVar4 = (PyTypeObject *)PyFrame_GetBack(op);
      _Py_DECREF((PyObject *)op);
      op = pPVar4;
    }
    if (message_error_string._M_string_length == 0) goto LAB_0011f3fa;
  }
  std::operator+(&local_88,"\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: ",&message_error_string);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_88);
LAB_0011f3fa:
  std::__cxx11::string::~string((string *)&message_error_string);
  return __return_storage_ptr__;
}

Assistant:

std::string format_value_and_trace() const {
        std::string result;
        std::string message_error_string;
        if (m_value) {
            auto value_str = reinterpret_steal<object>(PyObject_Str(m_value.ptr()));
            constexpr const char *message_unavailable_exc
                = "<MESSAGE UNAVAILABLE DUE TO ANOTHER EXCEPTION>";
            if (!value_str) {
                message_error_string = detail::error_string();
                result = message_unavailable_exc;
            } else {
                // Not using `value_str.cast<std::string>()`, to not potentially throw a secondary
                // error_already_set that will then result in process termination (#4288).
                auto value_bytes = reinterpret_steal<object>(
                    PyUnicode_AsEncodedString(value_str.ptr(), "utf-8", "backslashreplace"));
                if (!value_bytes) {
                    message_error_string = detail::error_string();
                    result = message_unavailable_exc;
                } else {
                    char *buffer = nullptr;
                    Py_ssize_t length = 0;
                    if (PyBytes_AsStringAndSize(value_bytes.ptr(), &buffer, &length) == -1) {
                        message_error_string = detail::error_string();
                        result = message_unavailable_exc;
                    } else {
                        result = std::string(buffer, static_cast<std::size_t>(length));
                    }
                }
            }
#if PY_VERSION_HEX >= 0x030B0000
            auto notes
                = reinterpret_steal<object>(PyObject_GetAttrString(m_value.ptr(), "__notes__"));
            if (!notes) {
                PyErr_Clear(); // No notes is good news.
            } else {
                auto len_notes = PyList_Size(notes.ptr());
                if (len_notes < 0) {
                    result += "\nFAILURE obtaining len(__notes__): " + detail::error_string();
                } else {
                    result += "\n__notes__ (len=" + std::to_string(len_notes) + "):";
                    for (ssize_t i = 0; i < len_notes; i++) {
                        PyObject *note = PyList_GET_ITEM(notes.ptr(), i);
                        auto note_bytes = reinterpret_steal<object>(
                            PyUnicode_AsEncodedString(note, "utf-8", "backslashreplace"));
                        if (!note_bytes) {
                            result += "\nFAILURE obtaining __notes__[" + std::to_string(i)
                                      + "]: " + detail::error_string();
                        } else {
                            char *buffer = nullptr;
                            Py_ssize_t length = 0;
                            if (PyBytes_AsStringAndSize(note_bytes.ptr(), &buffer, &length)
                                == -1) {
                                result += "\nFAILURE formatting __notes__[" + std::to_string(i)
                                          + "]: " + detail::error_string();
                            } else {
                                result += '\n';
                                result += std::string(buffer, static_cast<std::size_t>(length));
                            }
                        }
                    }
                }
            }
#endif
        } else {
            result = "<MESSAGE UNAVAILABLE>";
        }
        if (result.empty()) {
            result = "<EMPTY MESSAGE>";
        }

        bool have_trace = false;
        if (m_trace) {
#if !defined(PYPY_VERSION)
            auto *tb = reinterpret_cast<PyTracebackObject *>(m_trace.ptr());

            // Get the deepest trace possible.
            while (tb->tb_next) {
                tb = tb->tb_next;
            }

            PyFrameObject *frame = tb->tb_frame;
            Py_XINCREF(frame);
            result += "\n\nAt:\n";
            while (frame) {
#    if PY_VERSION_HEX >= 0x030900B1
                PyCodeObject *f_code = PyFrame_GetCode(frame);
#    else
                PyCodeObject *f_code = frame->f_code;
                Py_INCREF(f_code);
#    endif
                int lineno = PyFrame_GetLineNumber(frame);
                result += "  ";
                result += handle(f_code->co_filename).cast<std::string>();
                result += '(';
                result += std::to_string(lineno);
                result += "): ";
                result += handle(f_code->co_name).cast<std::string>();
                result += '\n';
                Py_DECREF(f_code);
#    if PY_VERSION_HEX >= 0x030900B1
                auto *b_frame = PyFrame_GetBack(frame);
#    else
                auto *b_frame = frame->f_back;
                Py_XINCREF(b_frame);
#    endif
                Py_DECREF(frame);
                frame = b_frame;
            }

            have_trace = true;
#endif //! defined(PYPY_VERSION)
        }

        if (!message_error_string.empty()) {
            if (!have_trace) {
                result += '\n';
            }
            result += "\nMESSAGE UNAVAILABLE DUE TO EXCEPTION: " + message_error_string;
        }

        return result;
    }